

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safecrt.h
# Opt level: O0

errno_t strcpy_s<256ul>(char (*_Dst) [256],char *_Src)

{
  errno_t eVar1;
  char *_Src_local;
  char (*_Dst_local) [256];
  
  eVar1 = strcpy_s(*_Dst,0x100,_Src);
  return eVar1;
}

Assistant:

inline
errno_t __cdecl strcpy_s(char (&_Dst)[_SizeInBytes], const char *_Src)
{
    return strcpy_s(_Dst, _SizeInBytes, _Src);
}